

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double __thiscall llvm::detail::IEEEFloat::remainder(IEEEFloat *this,double __x,double __y)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  IEEEFloat *in_RSI;
  double extraout_XMM0_Qa;
  MutableArrayRef<unsigned_long> parts_00;
  bool local_59;
  unsigned_long *puStack_58;
  bool ignored;
  integerPart *x;
  undefined4 local_48;
  int parts;
  undefined1 local_40 [4];
  uint origSign;
  IEEEFloat V;
  opStatus fs;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  IEEEFloat((IEEEFloat *)local_40,this);
  parts = (int)((byte)this->field_0x12 >> 3 & 1);
  V._20_4_ = divide((IEEEFloat *)local_40,in_RSI,rmNearestTiesToEven);
  if (V._20_4_ == opDivByZero) {
    V._20_4_ = 2;
  }
  else {
    x._4_4_ = partCount(this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)x._4_4_;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    puStack_58 = (unsigned_long *)operator_new__(uVar3);
    parts_00 = makeMutableArrayRef<unsigned_long>(puStack_58,(long)(int)x._4_4_);
    V._20_4_ = convertToInteger((IEEEFloat *)local_40,parts_00,x._4_4_ << 6,true,rmNearestTiesToEven
                                ,&local_59);
    if (V._20_4_ == opInvalidOp) {
      if (puStack_58 != (integerPart *)0x0) {
        operator_delete__(puStack_58);
      }
    }
    else {
      V._20_4_ = convertFromZeroExtendedInteger
                           ((IEEEFloat *)local_40,puStack_58,x._4_4_ << 6,true,rmNearestTiesToEven);
      if (V._20_4_ != opOK) {
        __assert_fail("fs==opOK",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c3,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      V._20_4_ = multiply((IEEEFloat *)local_40,in_RSI,rmNearestTiesToEven);
      if (V._20_4_ != opOK && V._20_4_ != opInexact) {
        __assert_fail("fs==opOK || fs==opInexact",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c6,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      V._20_4_ = subtract(this,(IEEEFloat *)local_40,rmNearestTiesToEven);
      if (V._20_4_ != opOK && V._20_4_ != opInexact) {
        __assert_fail("fs==opOK || fs==opInexact",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c9,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      bVar2 = isZero(this);
      if (bVar2) {
        this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)parts & 1) << 3;
      }
      if (puStack_58 != (integerPart *)0x0) {
        operator_delete__(puStack_58);
      }
    }
  }
  local_48 = 1;
  ~IEEEFloat((IEEEFloat *)local_40);
  return extraout_XMM0_Qa;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::remainder(const IEEEFloat &rhs) {
  opStatus fs;
  IEEEFloat V = *this;
  unsigned int origSign = sign;

  fs = V.divide(rhs, rmNearestTiesToEven);
  if (fs == opDivByZero)
    return fs;

  int parts = partCount();
  integerPart *x = new integerPart[parts];
  bool ignored;
  fs = V.convertToInteger(makeMutableArrayRef(x, parts),
                          parts * integerPartWidth, true, rmNearestTiesToEven,
                          &ignored);
  if (fs == opInvalidOp) {
    delete[] x;
    return fs;
  }

  fs = V.convertFromZeroExtendedInteger(x, parts * integerPartWidth, true,
                                        rmNearestTiesToEven);
  assert(fs==opOK); (void)fs; // should always work

  fs = V.multiply(rhs, rmNearestTiesToEven);
  assert(fs==opOK || fs==opInexact); (void)fs; // should not overflow or underflow

  fs = subtract(V, rmNearestTiesToEven);
  assert(fs==opOK || fs==opInexact); (void)fs; // likewise

  if (isZero())
    sign = origSign;    // IEEE754 requires this
  delete[] x;
  return fs;
}